

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expand_lz4.c
# Opt level: O0

void test_expand_lz4(void)

{
  wchar_t wVar1;
  wchar_t wVar2;
  int f;
  char *reffile;
  
  extract_reference_file("test_expand.lz4");
  wVar1 = systemf("%s %s >test.out 2>test.err",testprog,"test_expand.lz4");
  if ((wVar1 != L'\0') && (wVar2 = canLz4(), wVar2 == L'\0')) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cat/test/test_expand_lz4.c"
                   ,L'\x16');
    test_skipping("It seems lz4 is not supported on this platform");
    return;
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cat/test/test_expand_lz4.c"
                      ,L'\x12',0,"0",(long)wVar1,"f",(void *)0x0);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cat/test/test_expand_lz4.c"
             ,L'\x13',"contents of test_expand.lz4.\n","test.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cat/test/test_expand_lz4.c"
             ,L'\x14',"test.err");
  return;
}

Assistant:

DEFINE_TEST(test_expand_lz4)
{
	const char *reffile = "test_expand.lz4";
	int f;

	extract_reference_file(reffile);
	f = systemf("%s %s >test.out 2>test.err", testprog, reffile);
	if (f == 0 || canLz4()) {
		assertEqualInt(0, f);
		assertTextFileContents("contents of test_expand.lz4.\n", "test.out");
		assertEmptyFile("test.err");
	} else {
		skipping("It seems lz4 is not supported on this platform");
	}
}